

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp0_helper.c
# Opt level: O0

void helper_mtc0_vpecontrol_mips64(CPUMIPSState_conflict5 *env,target_ulong arg1)

{
  uint32_t newval;
  uint32_t mask;
  target_ulong arg1_local;
  CPUMIPSState_conflict5 *env_local;
  
  env->CP0_VPEControl = env->CP0_VPEControl & 0xffcf7f00U | (uint)arg1 & 0x3080ff;
  return;
}

Assistant:

void helper_mtc0_vpecontrol(CPUMIPSState *env, target_ulong arg1)
{
    uint32_t mask;
    uint32_t newval;

    mask = (1 << CP0VPECo_YSI) | (1 << CP0VPECo_GSI) |
           (1 << CP0VPECo_TE) | (0xff << CP0VPECo_TargTC);
    newval = (env->CP0_VPEControl & ~mask) | (arg1 & mask);

    /*
     * Yield scheduler intercept not implemented.
     * Gating storage scheduler intercept not implemented.
     */

    /* TODO: Enable/disable TCs. */

    env->CP0_VPEControl = newval;
}